

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O3

Node * __thiscall
llvm::FoldingSetBase::FindNodeOrInsertPos
          (FoldingSetBase *this,FoldingSetNodeID *ID,void **InsertPos)

{
  uint *first;
  void **ppvVar1;
  int iVar2;
  type tVar3;
  uint uVar4;
  Node *pNVar5;
  FoldingSetNodeID TempID;
  undefined1 *local_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined1 local_b0 [128];
  
  first = (uint *)(ID->Bits).super_SmallVectorImpl<unsigned_int>.
                  super_SmallVectorTemplateBase<unsigned_int,_true>.
                  super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX;
  tVar3 = hashing::detail::hash_combine_range_impl<unsigned_int_const>
                    (first,first + (ID->Bits).super_SmallVectorImpl<unsigned_int>.
                                   super_SmallVectorTemplateBase<unsigned_int,_true>.
                                   super_SmallVectorTemplateCommon<unsigned_int,_void>.
                                   super_SmallVectorBase.Size);
  ppvVar1 = this->Buckets;
  uVar4 = this->NumBuckets - 1 & (uint)tVar3.value;
  pNVar5 = (Node *)ppvVar1[uVar4];
  *InsertPos = (void *)0x0;
  local_c0 = local_b0;
  uStack_b4 = 0x20;
  if (pNVar5 != (Node *)0x0 && ((ulong)pNVar5 & 1) == 0) {
    do {
      local_b8 = 0;
      iVar2 = (*this->_vptr_FoldingSetBase[2])(this,pNVar5,ID,tVar3.value & 0xffffffff,&local_c0);
      if ((char)iVar2 != '\0') goto LAB_001a254b;
      pNVar5 = (Node *)pNVar5->NextInFoldingSetBucket;
    } while ((pNVar5 != (Node *)0x0) && (((ulong)pNVar5 & 1) == 0));
  }
  local_b8 = 0;
  *InsertPos = ppvVar1 + uVar4;
  pNVar5 = (Node *)0x0;
LAB_001a254b:
  if (local_c0 != local_b0) {
    free(local_c0);
  }
  return pNVar5;
}

Assistant:

FoldingSetBase::Node *
FoldingSetBase::FindNodeOrInsertPos(const FoldingSetNodeID &ID,
                                    void *&InsertPos) {
  unsigned IDHash = ID.ComputeHash();
  void **Bucket = GetBucketFor(IDHash, Buckets, NumBuckets);
  void *Probe = *Bucket;

  InsertPos = nullptr;

  FoldingSetNodeID TempID;
  while (Node *NodeInBucket = GetNextPtr(Probe)) {
    if (NodeEquals(NodeInBucket, ID, IDHash, TempID))
      return NodeInBucket;
    TempID.clear();

    Probe = NodeInBucket->getNextInBucket();
  }

  // Didn't find the node, return null with the bucket as the InsertPos.
  InsertPos = Bucket;
  return nullptr;
}